

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

bool __thiscall flexbuffers::Reference::MutateString(Reference *this,char *str)

{
  bool bVar1;
  size_t len;
  char *str_local;
  Reference *this_local;
  
  len = strlen(str);
  bVar1 = MutateString(this,str,len);
  return bVar1;
}

Assistant:

bool MutateString(const char *str) { return MutateString(str, strlen(str)); }